

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  uint local_280;
  uint32_t i;
  istream local_270 [8];
  ifstream fs;
  undefined1 local_68 [8];
  Nes nes;
  char **argv_local;
  int argc_local;
  
  if (argc == 2) {
    nes.cycle_ = (uint64_t)argv;
    n_e_s::nes::Nes::Nes((Nes *)local_68);
    std::ifstream::ifstream(local_270,*(char **)(nes.cycle_ + 8),_S_bin);
    n_e_s::nes::Nes::load_rom((Nes *)local_68,local_270);
    for (local_280 = 0; local_280 < 10000000; local_280 = local_280 + 1) {
      n_e_s::nes::Nes::execute((Nes *)local_68);
    }
    argv_local._4_4_ = 0;
    std::ifstream::~ifstream(local_270);
    n_e_s::nes::Nes::~Nes((Nes *)local_68);
  }
  else {
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv) {
    if (argc != 2) {
        return 1;
    }

    Nes nes;
    std::ifstream fs(argv[1], std::ios::binary);
    nes.load_rom(fs);

    for (uint32_t i = 0; i < 10'000'000; ++i) {
        nes.execute();
    }

    return 0;
}